

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall MeasurementToString_empty_Test::TestBody(MeasurementToString_empty_Test *this)

{
  bool bVar1;
  measurement *measure;
  char *message;
  uint64_t in_RCX;
  AssertHelper local_70;
  Message local_68 [3];
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  measurement m1;
  MeasurementToString_empty_Test *this_local;
  
  units::measurement::measurement((measurement *)&gtest_ar.message_,45.7,(unit *)&units::one);
  measure = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_50,(units *)&gtest_ar.message_,measure,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_30,"to_string(m1)","\"45.7\"",&local_50,(char (*) [5])"45.7");
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x88,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(MeasurementToString, empty)
{
    measurement m1(45.7, one);
    EXPECT_EQ(to_string(m1), "45.7");
}